

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_ptr.hpp
# Opt level: O0

AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> * __thiscall
AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::operator=
          (AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *this,
          AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *other)

{
  AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *other_local;
  AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *this_local;
  
  if (this != other) {
    reset(this,(OPNChipBase *)0x0);
    this->m_p = other->m_p;
    this->m_counter = other->m_counter;
    if (this->m_counter != (size_t *)0x0) {
      *this->m_counter = *this->m_counter + 1;
    }
  }
  return this;
}

Assistant:

AdlMIDI_SPtr &operator=(const AdlMIDI_SPtr &other)
    {
        if(this == &other)
            return *this;
        reset();
        m_p = other.m_p;
        m_counter = other.m_counter;
        if(m_counter)
            ++*m_counter;
        return *this;
    }